

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O0

int fffstrint(char *input,long ntodo,double scale,double zero,long twidth,double implipower,
             int nullcheck,char *snull,int nullval,char *nullarray,int *anynull,int *output,
             int *status)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  double dVar8;
  int local_fc;
  int decpt;
  int esign;
  int sign;
  int exponent;
  double power;
  double val;
  char chrzero;
  char tempstore;
  char *tpos;
  char *cptr;
  char message [81];
  char *cstring;
  double dvalue;
  long ii;
  int nullen;
  int nullval_local;
  char *snull_local;
  int nullcheck_local;
  double implipower_local;
  long twidth_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  char *input_local;
  
  sVar6 = strlen(snull);
  dvalue = 0.0;
  tpos = input;
  do {
    if (ntodo <= (long)dvalue) {
      return *status;
    }
    stack0xffffffffffffff90 = tpos;
    pcVar7 = tpos + twidth;
    cVar1 = *pcVar7;
    *pcVar7 = '\0';
    if ((*snull == '\x01') || (iVar5 = strncmp(snull,tpos,(long)(int)sVar6), iVar5 != 0)) {
      bVar4 = false;
      decpt = 1;
      power = 0.0;
      _sign = 1.0;
      esign = 0;
      local_fc = 1;
      for (; *tpos == ' '; tpos = tpos + 1) {
      }
      if ((*tpos == '-') || (*tpos == '+')) {
        if (*tpos == '-') {
          decpt = -1;
        }
        do {
          tpos = tpos + 1;
        } while (*tpos == ' ');
      }
      while( true ) {
        bVar2 = false;
        if ('/' < *tpos) {
          bVar2 = *tpos < ':';
        }
        if (!bVar2) break;
        power = (power * 10.0 + (double)(int)*tpos) - 48.0;
        do {
          tpos = tpos + 1;
        } while (*tpos == ' ');
      }
      if ((*tpos == '.') || (*tpos == ',')) {
        bVar4 = true;
        do {
          tpos = tpos + 1;
        } while (*tpos == ' ');
        while( true ) {
          bVar2 = false;
          if ('/' < *tpos) {
            bVar2 = *tpos < ':';
          }
          if (!bVar2) break;
          power = (power * 10.0 + (double)(int)*tpos) - 48.0;
          _sign = _sign * 10.0;
          do {
            tpos = tpos + 1;
          } while (*tpos == ' ');
        }
      }
      if ((*tpos == 'E') || (*tpos == 'D')) {
        do {
          pcVar3 = tpos;
          tpos = pcVar3 + 1;
        } while (*tpos == ' ');
        if ((*tpos == '-') || (*tpos == '+')) {
          if (*tpos == '-') {
            local_fc = -1;
          }
          for (tpos = pcVar3 + 2; *tpos == ' '; tpos = tpos + 1) {
          }
        }
        while( true ) {
          bVar2 = false;
          if ('/' < *tpos) {
            bVar2 = *tpos < ':';
          }
          if (!bVar2) break;
          esign = esign * 10 + (int)*tpos + -0x30;
          do {
            tpos = tpos + 1;
          } while (*tpos == ' ');
        }
      }
      if (*tpos != '\0') {
        snprintf((char *)&cptr,0x51,"Cannot read number from ASCII table");
        ffpmsg((char *)&cptr);
        snprintf((char *)&cptr,0x51,"Column field = %s.",stack0xffffffffffffff90);
        ffpmsg((char *)&cptr);
        *pcVar7 = cVar1;
        *status = 0x199;
        return 0x199;
      }
      if (!bVar4) {
        _sign = implipower;
      }
      dVar8 = pow(10.0,(double)(local_fc * esign));
      dVar8 = (((double)decpt * power) / _sign) * dVar8 * scale + zero;
      if (-2147483648.49 <= dVar8) {
        if (dVar8 <= 2147483647.49) {
          output[(long)dvalue] = (int)(long)dVar8;
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        output[(long)dvalue] = -0x80000000;
      }
    }
    else {
      if (nullcheck != 0) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[(long)dvalue] = nullval;
        }
        else {
          nullarray[(long)dvalue] = '\x01';
        }
      }
      tpos = tpos + twidth;
    }
    *pcVar7 = cVar1;
    dvalue = (double)((long)dvalue + 1);
  } while( true );
}

Assistant:

int fffstrint(char *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            long twidth,          /* I - width of each substring of chars    */
            double implipower,    /* I - power of 10 of implied decimal      */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            char  *snull,         /* I - value of FITS null string, if any   */
            int nullval,          /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            int *output,          /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file. Check
  for null values and do scaling if required. The nullcheck code value
  determines how any null values in the input array are treated. A null
  value is an input pixel that is equal to snull.  If nullcheck= 0, then
  no special checking for nulls is performed.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    int nullen;
    long ii;
    double dvalue;
    char *cstring, message[FLEN_ERRMSG];
    char *cptr, *tpos;
    char tempstore, chrzero = '0';
    double val, power;
    int exponent, sign, esign, decpt;

    nullen = strlen(snull);
    cptr = input;  /* pointer to start of input string */
    for (ii = 0; ii < ntodo; ii++)
    {
      cstring = cptr;
      /* temporarily insert a null terminator at end of the string */
      tpos = cptr + twidth;
      tempstore = *tpos;
      *tpos = 0;

      /* check if null value is defined, and if the    */
      /* column string is identical to the null string */
      if (snull[0] != ASCII_NULL_UNDEFINED && 
         !strncmp(snull, cptr, nullen) )
      {
        if (nullcheck)  
        {
          *anynull = 1;    
          if (nullcheck == 1)
            output[ii] = nullval;
          else
            nullarray[ii] = 1;
        }
        cptr += twidth;
      }
      else
      {
        /* value is not the null value, so decode it */
        /* remove any embedded blank characters from the string */

        decpt = 0;
        sign = 1;
        val  = 0.;
        power = 1.;
        exponent = 0;
        esign = 1;

        while (*cptr == ' ')               /* skip leading blanks */
           cptr++;

        if (*cptr == '-' || *cptr == '+')  /* check for leading sign */
        {
          if (*cptr == '-')
             sign = -1;

          cptr++;

          while (*cptr == ' ')         /* skip blanks between sign and value */
            cptr++;
        }

        while (*cptr >= '0' && *cptr <= '9')
        {
          val = val * 10. + *cptr - chrzero;  /* accumulate the value */
          cptr++;

          while (*cptr == ' ')         /* skip embedded blanks in the value */
            cptr++;
        }

        if (*cptr == '.' || *cptr == ',')       /* check for decimal point */
        {
          decpt = 1;       /* set flag to show there was a decimal point */
          cptr++;
          while (*cptr == ' ')         /* skip any blanks */
            cptr++;

          while (*cptr >= '0' && *cptr <= '9')
          {
            val = val * 10. + *cptr - chrzero;  /* accumulate the value */
            power = power * 10.;
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks in the value */
              cptr++;
          }
        }

        if (*cptr == 'E' || *cptr == 'D')  /* check for exponent */
        {
          cptr++;
          while (*cptr == ' ')         /* skip blanks */
              cptr++;
  
          if (*cptr == '-' || *cptr == '+')  /* check for exponent sign */
          {
            if (*cptr == '-')
               esign = -1;

            cptr++;

            while (*cptr == ' ')        /* skip blanks between sign and exp */
              cptr++;
          }

          while (*cptr >= '0' && *cptr <= '9')
          {
            exponent = exponent * 10 + *cptr - chrzero;  /* accumulate exp */
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks */
              cptr++;
          }
        }

        if (*cptr  != 0)  /* should end up at the null terminator */
        {
          snprintf(message, FLEN_ERRMSG,"Cannot read number from ASCII table");
          ffpmsg(message);
          snprintf(message, FLEN_ERRMSG,"Column field = %s.", cstring);
          ffpmsg(message);
          /* restore the char that was overwritten by the null */
          *tpos = tempstore;
          return(*status = BAD_C2D);
        }

        if (!decpt)  /* if no explicit decimal, use implied */
           power = implipower;

        dvalue = (sign * val / power) * pow(10., (double) (esign * exponent));

        dvalue = dvalue * scale + zero;   /* apply the scaling */

        if (dvalue < DINT_MIN)
        {
            *status = OVERFLOW_ERR;
            output[ii] = INT_MIN;
        }
        else if (dvalue > DINT_MAX)
        {
            *status = OVERFLOW_ERR;
            output[ii] = INT_MAX;
        }
        else
            output[ii] = (long) dvalue;
      }
      /* restore the char that was overwritten by the null */
      *tpos = tempstore;
    }
    return(*status);
}